

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O0

HighsDebugStatus
debugDualChuzcFailQuad0
          (HighsOptions *options,HighsInt workCount,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *workData,
          HighsInt numVar,double *workDual,double selectTheta,double remainTheta,bool force)

{
  HighsInt in_ECX;
  double *in_RDX;
  uint in_ESI;
  long in_RDI;
  double *in_R8;
  byte in_R9B;
  HighsLogOptions *in_XMM0_Qa;
  HighsLogType HVar1;
  double workDualNorm;
  double workDataNorm;
  HighsLogType local_58;
  HighsLogOptions *local_50;
  undefined4 in_stack_ffffffffffffffe8;
  HighsDebugStatus local_4;
  
  if ((*(int *)(in_RDI + 0x15c) < 2) && ((in_R9B & 1) == 0)) {
    local_4 = kNotChecked;
  }
  else {
    highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kInfo,
                "DualChuzC:     No change in loop 2 so return error\n");
    debugDualChuzcFailNorms
              ((HighsInt)((ulong)in_RDI >> 0x20),
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,in_ECX,in_R8,(double *)in_XMM0_Qa);
    highsLogDev(in_XMM0_Qa,_HVar1,(char *)(in_RDI + 0x380),1,
                "DualChuzC:     workCount = %d; selectTheta=%g; remainTheta=%g\n",(ulong)in_ESI);
    highsLogDev(local_50,_local_58,(char *)(in_RDI + 0x380),1,
                "DualChuzC:     workDataNorm = %g; workDualNorm = %g\n");
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsDebugStatus debugDualChuzcFailQuad0(
    const HighsOptions& options, const HighsInt workCount,
    const std::vector<std::pair<HighsInt, double>>& workData,
    const HighsInt numVar, const double* workDual, const double selectTheta,
    const double remainTheta, const bool force) {
  // Non-trivially expensive assessment of CHUZC failure
  if (options.highs_debug_level < kHighsDebugLevelCostly && !force)
    return HighsDebugStatus::kNotChecked;

  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     No change in loop 2 so return error\n");
  double workDataNorm;
  double workDualNorm;
  debugDualChuzcFailNorms(workCount, workData, workDataNorm, numVar, workDual,
                          workDualNorm);
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     workCount = %" HIGHSINT_FORMAT
              "; selectTheta=%g; remainTheta=%g\n",
              workCount, selectTheta, remainTheta);
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     workDataNorm = %g; workDualNorm = %g\n",
              workDataNorm, workDualNorm);
  return HighsDebugStatus::kOk;
}